

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,OptionStyle style)

{
  ErrorCollector *pEVar1;
  Parser *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  FieldDescriptor *pFVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UninterpretedOption *uninterpreted_option;
  long lVar8;
  string *value;
  Parser *pPVar9;
  uint uVar10;
  LocationRecorder *pLVar11;
  LocationRecorder name_location;
  LocationRecorder part_location;
  LocationRecorder location;
  undefined1 local_d0 [16];
  undefined1 local_c0 [59];
  LogFinisher local_85 [5];
  LocationRecorder local_80;
  Parser *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  local_85._1_4_ = style;
  iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x13])(options);
  local_68._M_allocated_capacity = (size_type)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"uninterpreted_option","");
  pFVar6 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT44(extraout_var,iVar4),(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_allocated_capacity != local_58) {
    operator_delete((void *)local_68._M_allocated_capacity,local_58[0]._M_allocated_capacity + 1);
  }
  local_70 = this;
  if (pFVar6 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/parser.cc"
               ,0x3c4);
    pLVar7 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_68,"CHECK failed: uninterpreted_option_field != NULL: "
                       );
    pLVar7 = internal::LogMessage::operator<<
                       (pLVar7,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)local_d0,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)&local_68);
  }
  iVar5 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
  iVar4 = *(int *)(pFVar6 + 0x28);
  iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x30))
                    ((long *)CONCAT44(extraout_var_00,iVar5),options,pFVar6);
  LocationRecorder::Init(&local_80,options_location);
  LocationRecorder::AddPath(&local_80,iVar4);
  LocationRecorder::AddPath(&local_80,iVar5);
  this_00 = local_70;
  if ((local_85._1_4_ != OPTION_STATEMENT) || (bVar2 = Consume(local_70,"option"), bVar2)) {
    iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
    uninterpreted_option =
         (UninterpretedOption *)
         (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x208))
                   ((long *)CONCAT44(extraout_var_01,iVar4),options,pFVar6,0);
    if ((uninterpreted_option != (UninterpretedOption *)0x0) &&
       (lVar8 = __dynamic_cast(uninterpreted_option,&Message::typeinfo,
                               &UninterpretedOption::typeinfo,0), lVar8 == 0)) {
      __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                    ,0x158,
                    "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::UninterpretedOption *, From = google::protobuf::Message]"
                   );
    }
    LocationRecorder::Init((LocationRecorder *)local_d0,&local_80);
    LocationRecorder::AddPath((LocationRecorder *)local_d0,2);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_d0,(Message *)uninterpreted_option,OPTION_NAME);
    iVar4 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
    LocationRecorder::Init((LocationRecorder *)(local_c0 + 0x28),(LocationRecorder *)local_d0);
    LocationRecorder::AddPath((LocationRecorder *)(local_c0 + 0x28),iVar4);
    bVar2 = ParseOptionNamePart(this_00,uninterpreted_option,(LocationRecorder *)(local_c0 + 0x28));
    LocationRecorder::~LocationRecorder((LocationRecorder *)(local_c0 + 0x28));
    if (bVar2) {
      pLVar11 = (LocationRecorder *)(local_c0 + 0x28);
      do {
        iVar4 = std::__cxx11::string::compare((char *)&(this_00->input_->current_).text);
        if (iVar4 != 0) {
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_d0);
          bVar2 = Consume(this_00,"=");
          if (!bVar2) goto LAB_0021a6b5;
          LocationRecorder::Init((LocationRecorder *)(local_c0 + 0x28),&local_80);
          LocationRecorder::RecordLegacyLocation
                    ((LocationRecorder *)(local_c0 + 0x28),(Message *)uninterpreted_option,
                     OPTION_VALUE);
          bVar2 = TryConsume(this_00,"-");
          switch((this_00->input_->current_).type) {
          case TYPE_START:
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/parser.cc"
                       ,0x3f7);
            pLVar7 = internal::LogMessage::operator<<
                               ((LogMessage *)local_d0,
                                "Trying to read value before any tokens have been read.");
            internal::LogFinisher::operator=(local_85,pLVar7);
            internal::LogMessage::~LogMessage((LogMessage *)local_d0);
            break;
          case TYPE_END:
            local_d0._0_8_ = local_c0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d0,"Unexpected end of stream while parsing option value.","")
            ;
            pEVar1 = this_00->error_collector_;
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)(uint)(this_00->input_->current_).line,
                         (ulong)(uint)(this_00->input_->current_).column,local_d0);
            }
LAB_0021a986:
            this_00->had_errors_ = true;
            if ((Parser *)local_d0._0_8_ != (Parser *)local_c0) goto LAB_0021a994;
            break;
          case TYPE_IDENTIFIER:
            LocationRecorder::AddPath((LocationRecorder *)(local_c0 + 0x28),3);
            if (bVar2) {
              local_d0._0_8_ = local_c0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d0,"Invalid \'-\' symbol before identifier.","");
              pEVar1 = this_00->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this_00->input_->current_).line,
                           (ulong)(uint)(this_00->input_->current_).column,local_d0);
              }
              goto LAB_0021a986;
            }
            local_d0._0_8_ = local_c0;
            local_d0._8_8_ = (Location *)0x0;
            local_c0[0] = '\0';
            bVar2 = ConsumeIdentifier(this_00,(string *)local_d0,"Expected identifier.");
            if (!bVar2) goto LAB_0021aa4f;
            UninterpretedOption::set_identifier_value(uninterpreted_option,(string *)local_d0);
LAB_0021aa2d:
            if ((Parser *)local_d0._0_8_ != (Parser *)local_c0) {
              operator_delete((void *)local_d0._0_8_,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
            }
            if (bVar2 != false) goto switchD_0021a742_default;
            break;
          case TYPE_INTEGER:
            bVar3 = ConsumeInteger64(this_00,(ulong)bVar2 - 1 | 0x8000000000000000,
                                     (uint64 *)local_d0,"Expected integer.");
            if (bVar3) {
              if (bVar2) {
                LocationRecorder::AddPath((LocationRecorder *)(local_c0 + 0x28),5);
                lVar8 = 0x38;
                uVar10 = 8;
                pPVar9 = (Parser *)-local_d0._0_8_;
              }
              else {
                uVar10 = 4;
                LocationRecorder::AddPath((LocationRecorder *)(local_c0 + 0x28),4);
                lVar8 = 0x30;
                pPVar9 = (Parser *)local_d0._0_8_;
              }
              uninterpreted_option->_has_bits_[0] = uninterpreted_option->_has_bits_[0] | uVar10;
              *(Parser **)((long)uninterpreted_option->_has_bits_ + lVar8 + -0x5c) = pPVar9;
              if (bVar3) goto switchD_0021a742_default;
            }
            break;
          case TYPE_FLOAT:
            LocationRecorder::AddPath((LocationRecorder *)(local_c0 + 0x28),6);
            bVar3 = ConsumeNumber(this_00,(double *)local_d0,"Expected number.");
            if (bVar3) {
              pPVar9 = (Parser *)local_d0._0_8_;
              if (bVar2) {
                pPVar9 = (Parser *)(local_d0._0_8_ ^ 0x8000000000000000);
              }
              uninterpreted_option->_has_bits_[0] = uninterpreted_option->_has_bits_[0] | 0x10;
              uninterpreted_option->double_value_ = (double)pPVar9;
              goto switchD_0021a742_default;
            }
            break;
          case TYPE_STRING:
            LocationRecorder::AddPath((LocationRecorder *)(local_c0 + 0x28),7);
            if (bVar2) {
              local_d0._0_8_ = local_c0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d0,"Invalid \'-\' symbol before string.","");
              pEVar1 = this_00->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this_00->input_->current_).line,
                           (ulong)(uint)(this_00->input_->current_).column,local_d0);
              }
              goto LAB_0021a986;
            }
            local_d0._0_8_ = local_c0;
            local_d0._8_8_ = (Location *)0x0;
            local_c0[0] = '\0';
            bVar2 = ConsumeString(this_00,(string *)local_d0,"Expected string.");
            if (bVar2) {
              UninterpretedOption::set_string_value(uninterpreted_option,(string *)local_d0);
              goto LAB_0021aa2d;
            }
LAB_0021aa4f:
            if ((Parser *)local_d0._0_8_ == (Parser *)local_c0) break;
LAB_0021a994:
            operator_delete((void *)local_d0._0_8_,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
            break;
          case TYPE_SYMBOL:
            iVar4 = std::__cxx11::string::compare((char *)&(this_00->input_->current_).text);
            if (iVar4 != 0) {
              local_d0._0_8_ = local_c0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d0,"Expected option value.","");
              pEVar1 = this_00->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this_00->input_->current_).line,
                           (ulong)(uint)(this_00->input_->current_).column,local_d0);
              }
              goto LAB_0021a986;
            }
            LocationRecorder::AddPath((LocationRecorder *)(local_c0 + 0x28),8);
            value = UninterpretedOption::mutable_aggregate_value_abi_cxx11_(uninterpreted_option);
            bVar2 = ParseUninterpretedBlock(this_00,value);
            if (bVar2) goto switchD_0021a742_default;
            break;
          default:
switchD_0021a742_default:
            LocationRecorder::~LocationRecorder((LocationRecorder *)(local_c0 + 0x28));
            if ((local_85._1_4_ == OPTION_STATEMENT) &&
               (bVar2 = ConsumeEndOfDeclaration(this_00,";",&local_80), !bVar2)) goto LAB_0021a6b5;
            bVar2 = true;
            goto LAB_0021a6b7;
          }
          pLVar11 = (LocationRecorder *)(local_c0 + 0x28);
          goto LAB_0021a6b0;
        }
        bVar2 = Consume(this_00,".");
        if (!bVar2) break;
        iVar4 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
        LocationRecorder::Init(pLVar11,(LocationRecorder *)local_d0);
        LocationRecorder::AddPath(pLVar11,iVar4);
        bVar2 = ParseOptionNamePart(this_00,uninterpreted_option,pLVar11);
        LocationRecorder::~LocationRecorder(pLVar11);
      } while (bVar2);
    }
    pLVar11 = (LocationRecorder *)local_d0;
LAB_0021a6b0:
    LocationRecorder::~LocationRecorder(pLVar11);
  }
LAB_0021a6b5:
  bVar2 = false;
LAB_0021a6b7:
  LocationRecorder::~LocationRecorder(&local_80);
  return bVar2;
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field = options->GetDescriptor()->
      FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option = down_cast<UninterpretedOption*>(
      options->GetReflection()->AddMessage(options,
                                           uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              -static_cast<int64>(value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}